

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O1

string * __thiscall Operand::str_abi_cxx11_(string *__return_storage_ptr__,Operand *this)

{
  pointer pcVar1;
  
  if (this->kind == 2) {
    std::operator+(__return_storage_ptr__,"#",&this->value);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (this->value)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->value)._M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

string str() const { return kind != OP_INTCONST ? value : "#" + value; }